

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  char *pcVar3;
  const_iterator cVar4;
  long *plVar5;
  TestFactoryBase *factory;
  _Base_ptr p_Var6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  _Rb_tree_node_base *p_Var10;
  string message;
  string full_name;
  allocator local_1b1;
  CodeLocation local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_108;
  _Rb_tree_node_base *local_b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  _Base_ptr local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _func_int **local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_80;
  
  UnitTest::GetInstance();
  p_Var6 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != p_Var10) {
    local_b0 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    local_a8 = &((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t.
                _M_impl.super__Rb_tree_header._M_header;
    paVar1 = &local_128.field_2;
    local_b8 = p_Var10;
    do {
      if (*(char *)&p_Var6[3]._M_parent == '\0') {
        __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
               *)(p_Var6 + 1);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_b0->_M_t,(key_type *)__k);
        if (cVar4._M_node == local_a8) {
          std::operator+(&local_188,"Type parameterized test suite ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1b0.file._M_dataplus._M_p = (pointer)&local_1b0.file.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1b0.file.field_2._M_allocated_capacity = *psVar7;
            local_1b0.file.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1b0.file.field_2._M_allocated_capacity = *psVar7;
            local_1b0.file._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1b0.file._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b0,*(ulong *)(p_Var6 + 1));
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar8) {
            local_128.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_128.field_2._8_8_ = plVar5[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_128._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_128._M_string_length = plVar5[1];
          *plVar5 = (long)paVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_168 = &local_158;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_158 = *plVar9;
            lStack_150 = plVar5[3];
          }
          else {
            local_158 = *plVar9;
            local_168 = (long *)*plVar5;
          }
          local_160 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != &local_1b0.file.field_2) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_128,"UninstantiatedTypeParameterizedTestSuite<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_148 = &local_138;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_138 = *plVar9;
            lStack_130 = plVar5[3];
          }
          else {
            local_138 = *plVar9;
            local_148 = (long *)*plVar5;
          }
          local_140 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          plVar5 = local_148;
          pcVar3 = *(char **)(p_Var6 + 2);
          _Var2 = p_Var6[3]._M_color;
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_168,local_160 + (long)local_168);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_80,__k);
          std::__cxx11::string::string((string *)&local_188,pcVar3,&local_1b1);
          local_1b0.file._M_dataplus._M_p = (pointer)&local_1b0.file.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,local_188._M_dataplus._M_p,
                     local_188._M_dataplus._M_p + local_188._M_string_length);
          local_1b0.line = _Var2;
          factory = (TestFactoryBase *)operator_new(0x78);
          if (local_a0 == &local_90) {
            local_128.field_2._8_8_ = local_90._8_8_;
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128._M_dataplus._M_p = (pointer)local_a0;
          }
          local_128.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
          local_128.field_2._M_local_buf[0] = local_90._M_local_buf[0];
          local_128._M_string_length = (size_type)local_98;
          local_98 = (_func_int **)0x0;
          local_90._M_local_buf[0] = '\0';
          local_a0 = &local_90;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_108,&local_80);
          factory->_vptr_TestFactoryBase =
               (_func_int **)
               (
               _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
               + 0x10);
          factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p == paVar1) {
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_128.field_2._M_allocated_capacity
            ;
            factory[4]._vptr_TestFactoryBase = (_func_int **)local_128.field_2._8_8_;
          }
          else {
            factory[1]._vptr_TestFactoryBase = (_func_int **)local_128._M_dataplus._M_p;
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_128.field_2._M_allocated_capacity
            ;
          }
          factory[2]._vptr_TestFactoryBase = (_func_int **)local_128._M_string_length;
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity =
               local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
                  *)(factory + 5),&local_108);
          MakeAndRegisterTestInfo
                    ("GoogleTestVerification",(char *)plVar5,(char *)0x0,(char *)0x0,&local_1b0,
                     &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108.second.code_location.file._M_dataplus._M_p !=
              &local_108.second.code_location.file.field_2) {
            operator_delete(local_108.second.code_location.file._M_dataplus._M_p,
                            local_108.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = local_b8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108.first._M_dataplus._M_p != &local_108.first.field_2) {
            operator_delete(local_108.first._M_dataplus._M_p,
                            local_108.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != &local_1b0.file.field_2) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.second.code_location.file._M_dataplus._M_p !=
              &local_80.second.code_location.file.field_2) {
            operator_delete(local_80.second.code_location.file._M_dataplus._M_p,
                            local_80.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,
                                              local_90._M_local_buf[0]) + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var10);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}